

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.hpp
# Opt level: O1

void qclab::printMatrix2x2<qclab::dense::SquareMatrix<std::complex<double>>>
               (SquareMatrix<std::complex<double>_> *mat)

{
  char cVar1;
  qclab *this;
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 in_RSI;
  ulong uVar2;
  complex<double> val;
  complex<double> val_00;
  complex<double> val_01;
  complex<double> val_02;
  
  if (mat->size_ == 2) {
    val._M_value._8_8_ = in_RDX;
    val._M_value._0_8_ = in_RSI;
    print<double>((qclab *)mat,val);
    val_00._M_value._8_8_ = extraout_RDX;
    val_00._M_value._0_8_ = in_RSI;
    print<double>((qclab *)mat,val_00);
    cVar1 = std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
    uVar2 = (ulong)(uint)(int)cVar1;
    this = (qclab *)std::ostream::put('\0');
    std::ostream::flush();
    val_01._M_value._8_8_ = extraout_RDX_00;
    val_01._M_value._0_8_ = uVar2;
    print<double>(this,val_01);
    val_02._M_value._8_8_ = extraout_RDX_01;
    val_02._M_value._0_8_ = uVar2;
    print<double>(this,val_02);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
    std::ostream::put('\0');
    std::ostream::flush();
    return;
  }
  __assert_fail("mat.rows() == 2",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/util.hpp"
                ,0x61,
                "void qclab::printMatrix2x2(const T &) [T = qclab::dense::SquareMatrix<std::complex<double>>]"
               );
}

Assistant:

void printMatrix2x2( const T& mat ) {
    assert( mat.rows() == 2 ) ;
    assert( mat.cols() == 2 ) ;
    print( mat(0,0) ) ; print( mat(0,1) ) ; std::cout << std::endl ;
    print( mat(1,0) ) ; print( mat(1,1) ) ; std::cout << std::endl ;
  }